

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O1

shared_ptr<const_PlanningUnitDecPOMDPDiscrete> * __thiscall
boost::shared_ptr<const_PlanningUnitDecPOMDPDiscrete>::operator=
          (shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *this,
          shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *r)

{
  sp_counted_base *psVar1;
  element_type *peVar2;
  sp_counted_base *psVar3;
  shared_count sStack_10;
  
  psVar1 = (r->pn).pi_;
  peVar2 = r->px;
  psVar3 = (r->pn).pi_;
  if (psVar1 != (sp_counted_base *)0x0) {
    LOCK();
    psVar1 = psVar1 + 8;
    *(int *)psVar1 = *(int *)psVar1 + 1;
    UNLOCK();
  }
  sStack_10.pi_ = (this->pn).pi_;
  this->px = peVar2;
  (this->pn).pi_ = psVar3;
  detail::shared_count::~shared_count(&sStack_10);
  return this;
}

Assistant:

shared_ptr & operator=( shared_ptr const & r ) BOOST_NOEXCEPT
    {
        this_type(r).swap(*this);
        return *this;
    }